

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

lws_mqtt_str_t * lws_mqtt_str_create_cstr_dup(char *buf,uint16_t lim)

{
  size_t sVar1;
  lws_mqtt_str_t *plVar2;
  undefined2 local_12;
  int len;
  uint16_t lim_local;
  char *buf_local;
  
  sVar1 = strlen(buf);
  local_12 = lim;
  if (lim == 0) {
    local_12 = (uint16_t)sVar1;
  }
  plVar2 = lws_mqtt_str_create_init((uint8_t *)buf,(uint16_t)sVar1,local_12);
  return plVar2;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create_cstr_dup(const char *buf, uint16_t lim)
{
	int len = strlen(buf);

	if (!lim)
		lim = len;

	return lws_mqtt_str_create_init((uint8_t *)buf, len, lim);
}